

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode copy_noInit(void *src,void *dst,UA_DataType *type)

{
  byte bVar1;
  UA_DataTypeMember *pUVar2;
  size_t size_00;
  UA_StatusCode UVar3;
  UA_DataType *type_00;
  void *pvVar4;
  void *pvVar5;
  size_t *psVar6;
  uint local_8c;
  size_t size;
  size_t *dst_size;
  size_t fi;
  UA_DataType *mt;
  UA_DataType *typelists [2];
  UA_DataTypeMember *m;
  size_t i;
  size_t *psStack_38;
  UA_Byte membersSize;
  uintptr_t ptrd;
  uintptr_t ptrs;
  UA_StatusCode retval;
  UA_DataType *type_local;
  void *dst_local;
  void *src_local;
  
  ptrs._4_4_ = 0;
  bVar1 = type->membersSize;
  psStack_38 = (size_t *)dst;
  ptrd = (uintptr_t)src;
  for (m = (UA_DataTypeMember *)0x0; m < (UA_DataTypeMember *)(ulong)bVar1;
      m = (UA_DataTypeMember *)((long)&m->memberName + 1)) {
    pUVar2 = type->members;
    typelists[0] = type + (int)-(uint)type->typeIndex;
    type_00 = typelists[(long)(int)(uint)((pUVar2[(long)m].field_0xb & 1 ^ 0xff) & 1) + -1] +
              pUVar2[(long)m].memberTypeIndex;
    if (((byte)pUVar2[(long)m].field_0xb >> 1 & 1) == 0) {
      pvVar4 = (void *)(pUVar2[(long)m].padding + ptrd);
      pvVar5 = (void *)((ulong)pUVar2[(long)m].padding + (long)psStack_38);
      if ((type_00->field_0x25 & 1) == 0) {
        local_8c = 0x19;
      }
      else {
        local_8c = (uint)type_00->typeIndex;
      }
      UVar3 = (*copyJumpTable[local_8c])(pvVar4,pvVar5,type_00);
      ptrs._4_4_ = UVar3 | ptrs._4_4_;
      ptrd = (ulong)type_00->memSize + (long)pvVar4;
      psStack_38 = (size_t *)((ulong)type_00->memSize + (long)pvVar5);
    }
    else {
      psVar6 = (size_t *)(pUVar2[(long)m].padding + ptrd);
      psStack_38 = (size_t *)((ulong)pUVar2[(long)m].padding + (long)psStack_38);
      size_00 = *psVar6;
      UVar3 = UA_Array_copy((void *)psVar6[1],size_00,(void **)(psStack_38 + 1),type_00);
      ptrs._4_4_ = UVar3 | ptrs._4_4_;
      if (ptrs._4_4_ == 0) {
        *psStack_38 = size_00;
      }
      else {
        *psStack_38 = 0;
      }
      ptrd = (uintptr_t)(psVar6 + 2);
      psStack_38 = psStack_38 + 2;
    }
  }
  return ptrs._4_4_;
}

Assistant:

static UA_StatusCode
copy_noInit(const void *src, void *dst, const UA_DataType *type) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    uintptr_t ptrs = (uintptr_t)src;
    uintptr_t ptrd = (uintptr_t)dst;
    UA_Byte membersSize = type->membersSize;
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *m= &type->members[i];
        const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
        const UA_DataType *mt = &typelists[!m->namespaceZero][m->memberTypeIndex];
        if(!m->isArray) {
            ptrs += m->padding;
            ptrd += m->padding;
            size_t fi = mt->builtin ? mt->typeIndex : UA_BUILTIN_TYPES_COUNT;
            retval |= copyJumpTable[fi]((const void*)ptrs, (void*)ptrd, mt);
            ptrs += mt->memSize;
            ptrd += mt->memSize;
        } else {
            ptrs += m->padding;
            ptrd += m->padding;
            size_t *dst_size = (size_t*)ptrd;
            const size_t size = *((const size_t*)ptrs);
            ptrs += sizeof(size_t);
            ptrd += sizeof(size_t);
            retval |= UA_Array_copy(*(void* const*)ptrs, size, (void**)ptrd, mt);
            if(retval == UA_STATUSCODE_GOOD)
                *dst_size = size;
            else
                *dst_size = 0;
            ptrs += sizeof(void*);
            ptrd += sizeof(void*);
        }
    }
    return retval;
}